

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::FormattedNumber::populateFieldPosition
          (FormattedNumber *this,FieldPosition *fieldPosition,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  FieldPosition *fieldPosition_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
    }
    else {
      FieldPosition::setBeginIndex(fieldPosition,0);
      FieldPosition::setEndIndex(fieldPosition,0);
      impl::NumberStringBuilder::nextFieldPosition(&this->fResults->string,fieldPosition,status);
    }
  }
  return;
}

Assistant:

void FormattedNumber::populateFieldPosition(FieldPosition& fieldPosition, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return;
    }
    // in case any users were depending on the old behavior:
    fieldPosition.setBeginIndex(0);
    fieldPosition.setEndIndex(0);
    fResults->string.nextFieldPosition(fieldPosition, status);
}